

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::update
          (HighsSparseMatrix *this,HighsInt var_in,HighsInt var_out,HighsSparseMatrix *matrix)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  long lVar11;
  int __tmp;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (var_in < this->num_col_) {
    piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)piVar5[var_in];
    if (piVar5[var_in] < piVar5[(long)var_in + 1]) {
      piVar6 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar2 = piVar6[lVar12];
        iVar3 = piVar7[iVar2];
        iVar4 = piVar8[iVar2];
        piVar8[iVar2] = iVar4 + -1;
        lVar14 = (long)iVar3 << 2;
        do {
          lVar13 = lVar14;
          iVar2 = *(int *)((long)piVar9 + lVar13);
          lVar14 = lVar13 + 4;
        } while (iVar2 != var_in);
        *(int *)((long)piVar9 + lVar13) = piVar9[(long)iVar4 + -1];
        piVar9[(long)iVar4 + -1] = iVar2;
        dVar1 = *(double *)((long)pdVar10 + lVar14 * 2 + -8);
        *(double *)((long)pdVar10 + lVar14 * 2 + -8) = pdVar10[(long)iVar4 + -1];
        pdVar10[(long)iVar4 + -1] = dVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < piVar5[(long)var_in + 1]);
    }
  }
  if (var_out < this->num_col_) {
    piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)piVar5[var_out];
    if (piVar5[var_out] < piVar5[(long)var_out + 1]) {
      piVar6 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar2 = piVar6[lVar12];
        iVar3 = piVar7[iVar2];
        lVar13 = (long)iVar3;
        piVar7[iVar2] = iVar3 + 1;
        lVar14 = lVar13 * 4;
        do {
          lVar11 = lVar14;
          iVar2 = *(int *)((long)piVar8 + lVar11);
          lVar14 = lVar11 + 4;
        } while (iVar2 != var_out);
        *(int *)((long)piVar8 + lVar11) = piVar8[lVar13];
        piVar8[lVar13] = iVar2;
        dVar1 = *(double *)((long)pdVar10 + lVar14 * 2 + -8);
        *(double *)((long)pdVar10 + lVar14 * 2 + -8) = pdVar10[lVar13];
        pdVar10[lVar13] = dVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < piVar5[(long)var_out + 1]);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::update(const HighsInt var_in, const HighsInt var_out,
                               const HighsSparseMatrix& matrix) {
  assert(matrix.format_ == MatrixFormat::kColwise);
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  if (var_in < this->num_col_) {
    for (HighsInt iEl = matrix.start_[var_in]; iEl < matrix.start_[var_in + 1];
         iEl++) {
      HighsInt iRow = matrix.index_[iEl];
      HighsInt iFind = this->start_[iRow];
      HighsInt iSwap = --this->p_end_[iRow];
      while (this->index_[iFind] != var_in) iFind++;
      // todo @ Julian : this assert can fail
      assert(iFind >= 0 && iFind < int(this->index_.size()));
      assert(iSwap >= 0 && iSwap < int(this->value_.size()));
      swap(this->index_[iFind], this->index_[iSwap]);
      swap(this->value_[iFind], this->value_[iSwap]);
    }
  }

  if (var_out < this->num_col_) {
    for (HighsInt iEl = matrix.start_[var_out];
         iEl < matrix.start_[var_out + 1]; iEl++) {
      HighsInt iRow = matrix.index_[iEl];
      HighsInt iFind = this->p_end_[iRow];
      HighsInt iSwap = this->p_end_[iRow]++;
      while (this->index_[iFind] != var_out) iFind++;
      swap(this->index_[iFind], this->index_[iSwap]);
      swap(this->value_[iFind], this->value_[iSwap]);
    }
  }
}